

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerLdNativeCodeData(Lowerer *this,Instr *instr)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  Func *pFVar6;
  CodeGenWorkItemIDL *pCVar7;
  MemRefOpnd *this_00;
  
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6f44,"(!instr->GetSrc1())","!instr->GetSrc1()");
    if (!bVar3) goto LAB_005a913c;
    *puVar5 = 0;
  }
  pFVar6 = this->m_func;
  if (pFVar6->parentFunc != (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6f45,"(m_func->IsTopFunc())","m_func->IsTopFunc()");
    if (!bVar3) goto LAB_005a913c;
    *puVar5 = 0;
    pFVar6 = this->m_func;
  }
  pIVar1 = instr->m_prev;
  pCVar7 = JITTimeWorkItem::GetWorkItemData(pFVar6->m_workItem);
  this_00 = IR::MemRefOpnd::New((void *)pCVar7->nativeDataAddr,TyUint64,this->m_func,
                                AddrOpndKindDynamicNativeCodeDataRef);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005a913c;
    *puVar5 = 0;
  }
  pFVar6 = instr->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005a913c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar4 = (this_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_00 = (MemRefOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar6);
    bVar4 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar4 | 2;
  instr->m_src1 = &this_00->super_Opnd;
  LowererMD::ChangeToAssign(instr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerLdNativeCodeData(IR::Instr * instr)
{
    Assert(!instr->GetSrc1());
    Assert(m_func->IsTopFunc());
    IR::Instr * instrPrev = instr->m_prev;
    instr->SetSrc1(IR::MemRefOpnd::New((void*)m_func->GetWorkItem()->GetWorkItemData()->nativeDataAddr, TyMachPtr, m_func, IR::AddrOpndKindDynamicNativeCodeDataRef));

    LowererMD::ChangeToAssign(instr);

    return instrPrev;
}